

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_circle3d(rf_vec3 center,float radius,rf_vec3 rotation_axis,float rotationAngle,
                     rf_color color)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  undefined8 local_58;
  rf_int i;
  float rotationAngle_local;
  float radius_local;
  rf_color color_local;
  undefined4 local_34;
  undefined4 uStack_30;
  rf_vec3 rotation_axis_local;
  undefined4 local_18;
  undefined4 uStack_14;
  rf_vec3 center_local;
  
  _Var1 = rf_gfx_check_buffer_limit(0x48);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_18 = center.x;
  uStack_14 = center.y;
  rf_gfx_translatef(local_18,uStack_14,center.z);
  local_34 = rotation_axis.x;
  uStack_30 = rotation_axis.y;
  rf_gfx_rotatef(rotationAngle,local_34,uStack_30,rotation_axis.z);
  rf_gfx_begin(RF_LINES);
  for (local_58 = 0; local_58 < 0x168; local_58 = local_58 + 10) {
    rotationAngle_local._0_1_ = color.r;
    rotationAngle_local._1_1_ = color.g;
    rotationAngle_local._2_1_ = color.b;
    rotationAngle_local._3_1_ = color.a;
    rf_gfx_color4ub(rotationAngle_local._0_1_,rotationAngle_local._1_1_,rotationAngle_local._2_1_,
                    rotationAngle_local._3_1_);
    fVar2 = sinf((float)local_58 * 0.017453292);
    fVar3 = cosf((float)local_58 * 0.017453292);
    rf_gfx_vertex3f(fVar2 * radius,fVar3 * radius,0.0);
    fVar2 = sinf((float)(local_58 + 10) * 0.017453292);
    fVar3 = cosf((float)(local_58 + 10) * 0.017453292);
    rf_gfx_vertex3f(fVar2 * radius,fVar3 * radius,0.0);
  }
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_circle3d(rf_vec3 center, float radius, rf_vec3 rotation_axis, float rotationAngle, rf_color color)
{
    if (rf_gfx_check_buffer_limit(2 * 36)) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(center.x, center.y, center.z);
    rf_gfx_rotatef(rotationAngle, rotation_axis.x, rotation_axis.y, rotation_axis.z);

    rf_gfx_begin(RF_LINES);
    for (rf_int i = 0; i < 360; i += 10)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex3f(sinf(RF_DEG2RAD*i)*radius, cosf(RF_DEG2RAD*i)*radius, 0.0f);
        rf_gfx_vertex3f(sinf(RF_DEG2RAD*(i + 10))*radius, cosf(RF_DEG2RAD*(i + 10))*radius, 0.0f);
    }
    rf_gfx_end();
    rf_gfx_pop_matrix();
}